

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

bool testing::internal::
     TypeParameterizedTest<FlatBlockEstimatorTest,_testing::internal::TemplateSel<gtest_suite_FlatBlockEstimatorTest_::ExtractBlock>,_testing::internal::Types<BitDepthParams<unsigned_short,_8,_true>,_BitDepthParams<unsigned_short,_10,_true>,_BitDepthParams<unsigned_short,_12,_true>_>_>
     ::Register(char *prefix,CodeLocation *code_location,char *case_name,char *test_names,int index,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  bool bVar1;
  SetUpTearDownSuiteFuncType set_up_tc;
  SetUpTearDownSuiteFuncType tear_down_tc;
  TestFactoryBase *factory;
  SEARCH_METHODS *__rhs;
  char *str;
  allocator local_17d;
  int local_17c;
  internal *local_178;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_170;
  char *local_168;
  char *local_160;
  char *local_158 [4];
  string local_138;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  CodeLocation local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_17c = index;
  local_178 = (internal *)test_names;
  local_170 = type_names;
  std::__cxx11::string::string((string *)&local_50,prefix,&local_17d);
  __rhs = "/";
  if (*prefix == '\0') {
    __rhs = "";
  }
  local_160 = prefix;
  std::operator+(&local_f8,&local_50,(char *)__rhs);
  local_168 = case_name;
  std::operator+(&local_d8,&local_f8,case_name);
  std::operator+(&local_b8,&local_d8,"/");
  std::operator+(&local_98,&local_b8,
                 (local_170->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + local_17c);
  GetPrefixUntilComma_abi_cxx11_(&local_138,local_178,str);
  StripTrailingSpaces(&local_118,&local_138);
  GetTypeName<BitDepthParams<unsigned_short,8,true>>();
  CodeLocation::CodeLocation(&local_78,code_location);
  set_up_tc = SuiteApiResolver<gtest_suite_FlatBlockEstimatorTest_::ExtractBlock<BitDepthParams<unsigned_short,_8,_true>_>_>
              ::GetSetUpCaseOrSuite((code_location->file)._M_dataplus._M_p,code_location->line);
  tear_down_tc = SuiteApiResolver<gtest_suite_FlatBlockEstimatorTest_::ExtractBlock<BitDepthParams<unsigned_short,_8,_true>_>_>
                 ::GetTearDownCaseOrSuite
                           ((code_location->file)._M_dataplus._M_p,code_location->line);
  factory = (TestFactoryBase *)operator_new(8);
  factory->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_00efddc0;
  MakeAndRegisterTestInfo
            (local_98._M_dataplus._M_p,local_118._M_dataplus._M_p,local_158[0],(char *)0x0,&local_78
             ,&TypeIdHelper<FlatBlockEstimatorTest<BitDepthParams<unsigned_short,8,true>>>::dummy_,
             set_up_tc,tear_down_tc,factory);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)local_158);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_50);
  bVar1 = TypeParameterizedTest<FlatBlockEstimatorTest,_testing::internal::TemplateSel<gtest_suite_FlatBlockEstimatorTest_::ExtractBlock>,_testing::internal::Types<BitDepthParams<unsigned_short,_10,_true>,_BitDepthParams<unsigned_short,_12,_true>_>_>
          ::Register(local_160,code_location,local_168,(char *)local_178,local_17c + 1,local_170);
  return bVar1;
}

Assistant:

static bool Register(const char* prefix, const CodeLocation& code_location,
                       const char* case_name, const char* test_names, int index,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    typedef typename Types::Head Type;
    typedef Fixture<Type> FixtureClass;
    typedef typename GTEST_BIND_(TestSel, Type) TestClass;

    // First, registers the first type-parameterized test in the type
    // list.
    MakeAndRegisterTestInfo(
        (std::string(prefix) + (prefix[0] == '\0' ? "" : "/") + case_name +
         "/" + type_names[static_cast<size_t>(index)])
            .c_str(),
        StripTrailingSpaces(GetPrefixUntilComma(test_names)).c_str(),
        GetTypeName<Type>().c_str(),
        nullptr,  // No value parameter.
        code_location, GetTypeId<FixtureClass>(),
        SuiteApiResolver<TestClass>::GetSetUpCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        SuiteApiResolver<TestClass>::GetTearDownCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        new TestFactoryImpl<TestClass>);

    // Next, recurses (at compile time) with the tail of the type list.
    return TypeParameterizedTest<Fixture, TestSel,
                                 typename Types::Tail>::Register(prefix,
                                                                 code_location,
                                                                 case_name,
                                                                 test_names,
                                                                 index + 1,
                                                                 type_names);
  }